

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

Roaring * __thiscall doublechecked::Roaring::operator-=(Roaring *this,Roaring *r)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar3;
  uint value;
  _Rb_tree_color local_2c;
  
  roaring_bitmap_andnot_inplace((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  p_Var1 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_2c = p_Var1[1]._M_color;
      pVar3 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&(this->check)._M_t,&local_2c);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&(this->check)._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return this;
}

Assistant:

Roaring &operator-=(const Roaring &r) {
        plain -= r.plain;

        for (auto value : r.check)
            check.erase(value);  // Note std::remove() is not for ordered sets

        return *this;
    }